

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void predict(int argc,char **argv)

{
  char cVar1;
  int k;
  int iVar2;
  int iVar3;
  string infile;
  FastText fasttext;
  ifstream ifs;
  allocator aaStack_2a8 [32];
  undefined1 local_288 [32];
  __shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> _Stack_268;
  __shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> local_258;
  __shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2> _Stack_248;
  string local_228 [16];
  
  if (argc == 4) {
    k = 1;
  }
  else {
    if (argc != 5) {
      printPredictUsage();
      goto LAB_0010cef7;
    }
    k = atoi(argv[4]);
  }
  std::__cxx11::string::string((string *)local_228,argv[1],(allocator *)local_288);
  iVar2 = std::__cxx11::string::compare((char *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
    operator_delete(local_228[0]._M_dataplus._M_p);
  }
  _Stack_268 = (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)(ZEXT816(0) << 0x40);
  _Stack_248._M_ptr = (element_type *)0x0;
  _Stack_248._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_258._M_ptr = (element_type *)0x0;
  local_258._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_288 = ZEXT1632((undefined1  [16])_Stack_268);
  std::__cxx11::string::string((string *)local_228,argv[2],aaStack_2a8);
  ::fasttext::FastText::loadModel((FastText *)local_288,local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
    operator_delete(local_228[0]._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)aaStack_2a8,argv[3],(allocator *)local_228);
  iVar3 = std::__cxx11::string::compare((char *)aaStack_2a8);
  if (iVar3 == 0) {
    ::fasttext::FastText::predict((FastText *)local_288,(istream *)&std::cin,k,iVar2 == 0);
  }
  else {
    std::ifstream::ifstream(local_228,(string *)aaStack_2a8,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Input file cannot be opened!",0x1c);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_0010cef7:
      exit(1);
    }
    ::fasttext::FastText::predict((FastText *)local_288,(istream *)local_228,k,iVar2 == 0);
    std::ifstream::close();
    std::ifstream::~ifstream(local_228);
  }
  exit(0);
}

Assistant:

void predict(int argc, char** argv) {
  int32_t k;
  if (argc == 4) {
    k = 1;
  } else if (argc == 5) {
    k = atoi(argv[4]);
  } else {
    printPredictUsage();
    exit(EXIT_FAILURE);
  }
  bool print_prob = std::string(argv[1]) == "predict-prob";
  FastText fasttext;
  fasttext.loadModel(std::string(argv[2]));

  std::string infile(argv[3]);
  if (infile == "-") {
    fasttext.predict(std::cin, k, print_prob);
  } else {
    std::ifstream ifs(infile);
    if (!ifs.is_open()) {
      std::cerr << "Input file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
    fasttext.predict(ifs, k, print_prob);
    ifs.close();
  }

  exit(0);
}